

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

char * __thiscall cpptrace::lazy_exception::what(lazy_exception *this)

{
  char *__lhs;
  stacktrace *this_00;
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->what_string)._M_string_length == 0) {
    __lhs = (char *)(**(code **)((long)this->super_exception + 0x18))();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,":\n",&local_99);
    std::operator+(&local_58,__lhs,&local_78);
    this_00 = detail::lazy_trace_holder::get_resolved_trace(&this->trace_holder);
    stacktrace::to_string_abi_cxx11_(&local_98,this_00,false);
    std::operator+(&local_38,&local_58,&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->what_string,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return (this->what_string)._M_dataplus._M_p;
}

Assistant:

const char* lazy_exception::what() const noexcept {
        if(what_string.empty()) {
            what_string = message() + std::string(":\n") + trace_holder.get_resolved_trace().to_string();
        }
        return what_string.c_str();
    }